

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

bool __thiscall
Assimp::ASEImporter::CanRead(ASEImporter *this,string *pFile,IOSystem *pIOHandler,bool cs)

{
  bool bVar1;
  int iVar2;
  string extension;
  char *tokens [1];
  string local_50;
  char *local_30;
  
  BaseImporter::GetExtension(&local_50,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  bVar1 = true;
  if (iVar2 == 0) goto LAB_003d44e8;
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar2 == 0) goto LAB_003d44e8;
  if (local_50._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_003d44b7;
  }
  else if (pIOHandler != (IOSystem *)0x0 && cs) {
LAB_003d44b7:
    local_30 = "*3dsmax_asciiexport";
    bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_30,1,200,false,false);
    goto LAB_003d44e8;
  }
  bVar1 = false;
LAB_003d44e8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool ASEImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool cs) const {
    // check file extension
    const std::string extension = GetExtension(pFile);

    if (extension == "ase" || extension == "ask") {
        return true;
    }

    if ((!extension.length() || cs) && pIOHandler) {
        const char* tokens[] = {"*3dsmax_asciiexport"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}